

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeRTASBuilderGetBuildPropertiesExtPrologue
          (ZEParameterValidation *this,ze_rtas_builder_ext_handle_t hBuilder,
          ze_rtas_builder_build_op_ext_desc_t *pBuildOpDescriptor,
          ze_rtas_builder_ext_properties_t *pProperties)

{
  _ze_result_t retVal;
  ze_rtas_builder_ext_properties_t *pProperties_local;
  ze_rtas_builder_build_op_ext_desc_t *pBuildOpDescriptor_local;
  ze_rtas_builder_ext_handle_t hBuilder_local;
  ZEParameterValidation *this_local;
  
  if (hBuilder == (ze_rtas_builder_ext_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if (pBuildOpDescriptor == (ze_rtas_builder_build_op_ext_desc_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (pProperties == (ze_rtas_builder_ext_properties_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if ((int)pBuildOpDescriptor->rtasFormat < 0x7fffffff) {
    if ((int)pBuildOpDescriptor->buildQuality < 3) {
      if (pBuildOpDescriptor->buildFlags < 4) {
        this_local._4_4_ =
             ParameterValidation::validateExtensions<_ze_rtas_builder_build_op_ext_desc_t_const*>
                       (pBuildOpDescriptor);
        if (this_local._4_4_ == ZE_RESULT_SUCCESS) {
          this_local._4_4_ =
               ParameterValidation::validateExtensions<_ze_rtas_builder_ext_properties_t*>
                         (pProperties);
        }
      }
      else {
        this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
      }
    }
    else {
      this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
    }
  }
  else {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_ENUMERATION;
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeRTASBuilderGetBuildPropertiesExtPrologue(
        ze_rtas_builder_ext_handle_t hBuilder,          ///< [in] handle of builder object
        const ze_rtas_builder_build_op_ext_desc_t* pBuildOpDescriptor,  ///< [in] pointer to build operation descriptor
        ze_rtas_builder_ext_properties_t* pProperties   ///< [in,out] query result for builder properties
        )
    {
        if( nullptr == hBuilder )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == pBuildOpDescriptor )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pProperties )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( ZE_RTAS_FORMAT_EXT_MAX < pBuildOpDescriptor->rtasFormat )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( ZE_RTAS_BUILDER_BUILD_QUALITY_HINT_EXT_HIGH < pBuildOpDescriptor->buildQuality )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( 0x3 < pBuildOpDescriptor->buildFlags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        auto retVal = ZE_RESULT_SUCCESS;
        retVal = ParameterValidation::validateExtensions(pBuildOpDescriptor);
        if(retVal)
            return retVal;
        retVal = ParameterValidation::validateExtensions(pProperties);
        return retVal;
    }